

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::ModAsyncify<false,_true,_false>::visitBinary
          (ModAsyncify<false,_true,_false> *this,Binary *curr)

{
  bool bVar1;
  bool bVar2;
  Const *pCVar3;
  GlobalGet *pGVar4;
  Module *wasm;
  Builder local_40;
  Builder builder;
  int32_t checkedValue;
  int32_t value;
  GlobalGet *get;
  Const *c;
  bool flip;
  Binary *curr_local;
  ModAsyncify<false,_true,_false> *this_local;
  
  bVar1 = false;
  if (curr->op == NeInt32) {
    bVar1 = true;
  }
  else if (curr->op != EqInt32) {
    return;
  }
  pCVar3 = Expression::dynCast<wasm::Const>(curr->right);
  if (((pCVar3 != (Const *)0x0) &&
      (pGVar4 = Expression::dynCast<wasm::GlobalGet>(curr->left), pGVar4 != (GlobalGet *)0x0)) &&
     (bVar2 = IString::operator!=(&(pGVar4->name).super_IString,
                                  &(this->asyncifyStateName).super_IString), !bVar2)) {
    builder.wasm._0_4_ = wasm::Literal::geti32(&pCVar3->value);
    if ((int32_t)builder.wasm == 1) {
      builder.wasm._4_4_ = 0;
    }
    else {
      if ((int32_t)builder.wasm != 1) {
        return;
      }
      if ((this->unwinding & 1U) == 0) {
        return;
      }
      builder.wasm._4_4_ = 1;
      unsetUnwinding(this);
    }
    if (bVar1) {
      builder.wasm._4_4_ = 1 - builder.wasm._4_4_;
    }
    wasm = Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
           ::getModule((Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
                      );
    Builder::Builder(&local_40,wasm);
    pCVar3 = Builder::makeConst<int>(&local_40,builder.wasm._4_4_);
    Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
    ::replaceCurrent((Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
                      *)&(this->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
                     ,(Expression *)pCVar3);
  }
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    // Check if this is a comparison of the asyncify state to a specific
    // constant, which we may know is impossible.
    bool flip = false;
    if (curr->op == NeInt32) {
      flip = true;
    } else if (curr->op != EqInt32) {
      return;
    }
    auto* c = curr->right->dynCast<Const>();
    if (!c) {
      return;
    }
    auto* get = curr->left->dynCast<GlobalGet>();
    if (!get || get->name != asyncifyStateName) {
      return;
    }
    // This is a comparison of the state to a constant, check if we know the
    // value.
    int32_t value;
    auto checkedValue = c->value.geti32();
    if ((checkedValue == int(State::Unwinding) && neverUnwind) ||
        (checkedValue == int(State::Rewinding) && neverRewind)) {
      // We know the state is checked against an impossible value.
      value = 0;
    } else if (checkedValue == int(State::Unwinding) && this->unwinding) {
      // We know we are in fact unwinding right now.
      value = 1;
      unsetUnwinding();
    } else {
      return;
    }
    if (flip) {
      value = 1 - value;
    }
    Builder builder(*this->getModule());
    this->replaceCurrent(builder.makeConst(int32_t(value)));
  }